

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O2

int wait_for_edge(int pi,uint user_gpio,uint edge,double timeout)

{
  uint id;
  int iVar1;
  double dVar2;
  int triggered;
  int local_24;
  double local_20;
  
  local_24 = 0;
  iVar1 = -0x7db;
  if ((((uint)pi < 0x20) && (gPiInUse[(uint)pi] != 0)) && (iVar1 = 0, 0.0 < timeout)) {
    local_20 = timeout;
    dVar2 = time_time();
    local_20 = dVar2 + local_20;
    id = callback_ex(pi,user_gpio,edge,_wfe,&local_24);
    while (local_24 == 0) {
      dVar2 = time_time();
      if (local_20 <= dVar2) break;
      time_sleep(0.05);
    }
    callback_cancel(id);
    iVar1 = local_24;
  }
  return iVar1;
}

Assistant:

int wait_for_edge(int pi, unsigned user_gpio, unsigned edge, double timeout)
{
   int triggered = 0;
   int id;
   double due;

   if ((pi < 0) || (pi >= MAX_PI) || !gPiInUse[pi])
      return pigif_unconnected_pi;

   if (timeout <= 0.0) return 0;

   due = time_time() + timeout;

   id = callback_ex(pi, user_gpio, edge, _wfe, &triggered);

   while (!triggered && (time_time() < due)) time_sleep(0.05);

   callback_cancel(id);

   return triggered;
}